

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntPreInt
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> QiReshapedLiu;
  Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_> PI1;
  Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  undefined1 local_6f8 [16];
  Rhs local_6e8;
  Matrix3xN *local_6d8;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>,_Eigen::Matrix<double,_3,_8,_1,_3,_8>,_0>_>
  *local_6d0 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>
  local_6c0 [4];
  Matrix3xN local_600;
  Matrix3xN local_540;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>,_Eigen::Matrix<double,_3,_8,_1,_3,_8>,_0>_>
  local_480 [16];
  double local_470;
  non_const_type local_468;
  Matrix3xN *local_458;
  PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>> local_280 [592];
  
  local_6f8._8_8_ = local_6f8._0_8_;
  CalcCoordMatrix(this,&local_600);
  CalcCoordDerivMatrix(this,&local_540);
  local_6e8._0_8_ = 0x3fe0000000000000;
  local_6d0[0] = (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>,_Eigen::Matrix<double,_3,_8,_1,_3,_8>,_0>_>
                  *)&local_600;
  Eigen::operator*(local_6c0,(double *)&local_6e8,(StorageBaseType *)local_6d0);
  local_470 = local_6c0[0].m_lhs.m_functor.m_other;
  local_468 = local_6c0[0].m_rhs.m_matrix;
  local_458 = &local_600;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,8,1,8,8>>::
  _set_noalias<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,8,3,0,8,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>const>,Eigen::Matrix<double,3,8,1,3,8>,0>>
            (local_280,local_480);
  if (this->m_damping_enabled == true) {
    local_6e8._0_8_ = &local_540;
    Eigen::operator*(local_6c0,&this->m_Alpha,(StorageBaseType *)&local_6e8);
    local_458 = &local_600;
    local_470 = local_6c0[0].m_lhs.m_functor.m_other;
    local_468 = local_6c0[0].m_rhs.m_matrix;
    Eigen::MatrixBase<Eigen::Matrix<double,8,8,1,8,8>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,8,8,1,8,8>> *)local_280,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_3,_0,_8,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_>,_Eigen::Matrix<double,_3,_8,_1,_3,_8>,_0>_>
                *)local_480);
  }
  local_6e8._0_8_ = local_280;
  local_6d0[0] = local_480;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_6c0,&this->m_O1,&local_6e8);
  local_6f8._0_8_ = (StorageBaseType *)local_6d0;
  Eigen::
  NoAlias<Eigen::Map<Eigen::Matrix<double,64,1,0,64,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
  operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,64,1,0,64,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
             *)local_6f8,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_64,_1,_0,_64,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)local_6c0);
  Eigen::MatrixBase<Eigen::Matrix<double,8,8,1,8,8>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_8,_1,_8,_8>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_6c0,(MatrixBase<Eigen::Matrix<double,8,8,1,8,8>> *)local_480,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K3Compact);
  local_6f8._0_8_ = &this->m_K13Compact;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)local_6f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_8,_8,_1,_8,_8>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_6c0);
  local_6d8 = &local_600;
  local_6f8 = (undefined1  [16])
              Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->m_K13Compact,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>_> *)
                         &local_6d8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,3,1,8,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,3,8,1,3,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,3,1,8,3>> *)local_6c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>,_0>_>
              *)local_6f8);
  local_6f8._0_8_ = local_6c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,24,1,0,24,1>,0,Eigen::Stride<0,0>>>
            (Fi,(Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> *)local_6f8);
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}